

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall
CNode::CNode(CNode *this,NodeId idIn,shared_ptr<Sock> sock,CAddress *addrIn,
            uint64_t nKeyedNetGroupIn,uint64_t nLocalHostNonceIn,CAddress *addrBindIn,
            string *addrNameIn,ConnectionType conn_type_in,bool inbound_onion,
            CNodeOptions *node_opts)

{
  string *__return_storage_ptr__;
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  NetPermissionFlags *pNVar8;
  _Atomic_word _Var9;
  bool bVar10;
  _Head_base<0UL,_Transport_*,_false> _Var11;
  time_point tVar12;
  mapped_type *pmVar13;
  Logger *pLVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> other;
  pointer *__ptr;
  pointer __p;
  long lVar15;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  undefined7 in_stack_00000029;
  NodeId *args;
  list<CNetMessage,_std::allocator<CNetMessage>_> *args_1;
  __uniq_ptr_impl<V2Transport,_std::default_delete<V2Transport>_> local_40;
  long local_38;
  
  other = sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pNVar8 = (NetPermissionFlags *)CONCAT71(in_stack_00000029,inbound_onion);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)pNVar8[8] == 1) {
    _Var11._M_head_impl = (Transport *)operator_new(0x5a8);
    V2Transport::V2Transport
              ((V2Transport *)_Var11._M_head_impl,idIn,(ConnectionType)addrNameIn != INBOUND);
    local_40._M_t.super__Tuple_impl<0UL,_V2Transport_*,_std::default_delete<V2Transport>_>.
    super__Head_base<0UL,_V2Transport_*,_false>._M_head_impl =
         (tuple<V2Transport_*,_std::default_delete<V2Transport>_>)
         (_Tuple_impl<0UL,_V2Transport_*,_std::default_delete<V2Transport>_>)0x0;
    (this->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
    super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
    super__Head_base<0UL,_Transport_*,_false>._M_head_impl = _Var11._M_head_impl;
    std::unique_ptr<V2Transport,_std::default_delete<V2Transport>_>::~unique_ptr
              ((unique_ptr<V2Transport,_std::default_delete<V2Transport>_> *)&local_40);
  }
  else {
    _Var11._M_head_impl = (Transport *)operator_new(0x1b8);
    V1Transport::V1Transport((V1Transport *)_Var11._M_head_impl,idIn);
    (this->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
    super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
    super__Head_base<0UL,_Transport_*,_false>._M_head_impl = _Var11._M_head_impl;
  }
  this->m_permission_flags = *pNVar8;
  (this->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Sock;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            &(sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_socket;
  (this->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  this->m_send_memusage = 0;
  this->nSendBytes = 0;
  std::_Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::_M_initialize_map
            (&(this->vSendMsg).
              super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>,0);
  memset(&this->cs_vSend,0,0x90);
  tVar12 = NodeClock::now();
  (this->m_connected).__r = (long)tVar12.__d.__r / 1000000000;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)other._M_pi);
  _Var9 = other._M_pi[1]._M_weak_count;
  (this->addr).super_CService.super_CNetAddr.m_net = other._M_pi[1]._M_use_count;
  (this->addr).super_CService.super_CNetAddr.m_scope_id = _Var9;
  (this->addr).super_CService.port = *(uint16_t *)&other._M_pi[2]._vptr__Sp_counted_base;
  pcVar4 = (((prevector<16U,_unsigned_char,_unsigned_int,_int> *)(other._M_pi + 3))->_union).
           indirect_contents.indirect;
  (this->addr).nTime.__d.__r = *(rep *)&other._M_pi[2]._M_use_count;
  (this->addr).nServices = (ServiceFlags)pcVar4;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->addrBind,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)nLocalHostNonceIn);
  uVar3 = *(undefined8 *)(nLocalHostNonceIn + 0x18);
  (this->addrBind).super_CService.super_CNetAddr.m_net = (int)uVar3;
  (this->addrBind).super_CService.super_CNetAddr.m_scope_id = (int)((ulong)uVar3 >> 0x20);
  (this->addrBind).super_CService.port = *(uint16_t *)(nLocalHostNonceIn + 0x20);
  uVar5 = *(undefined4 *)(nLocalHostNonceIn + 0x2c);
  uVar6 = *(undefined4 *)(nLocalHostNonceIn + 0x30);
  uVar7 = *(undefined4 *)(nLocalHostNonceIn + 0x34);
  *(undefined4 *)&(this->addrBind).nTime.__d.__r = *(undefined4 *)(nLocalHostNonceIn + 0x28);
  *(undefined4 *)((long)&(this->addrBind).nTime.__d.__r + 4) = uVar5;
  *(undefined4 *)&(this->addrBind).nServices = uVar6;
  *(undefined4 *)((long)&(this->addrBind).nServices + 4) = uVar7;
  __return_storage_ptr__ = &this->m_addr_name;
  lVar15 = *(long *)((long)&(addrBindIn->super_CService).super_CNetAddr.m_addr._union + 8);
  if (lVar15 == 0) {
    CService::ToStringAddrPort_abi_cxx11_(__return_storage_ptr__,&(this->addr).super_CService);
  }
  else {
    (this->m_addr_name)._M_dataplus._M_p = (pointer)&(this->m_addr_name).field_2;
    pcVar4 = (addrBindIn->super_CService).super_CNetAddr.m_addr._union.indirect_contents.indirect;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + lVar15);
  }
  (this->m_dest)._M_dataplus._M_p = (pointer)&(this->m_dest).field_2;
  pcVar4 = (addrBindIn->super_CService).super_CNetAddr.m_addr._union.indirect_contents.indirect;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_dest,pcVar4,
             pcVar4 + *(long *)((long)&(addrBindIn->super_CService).super_CNetAddr.m_addr._union + 8
                               ));
  this->m_inbound_onion = (bool)(undefined1)conn_type_in;
  *(undefined8 *)&this->nVersion = 0;
  *(undefined8 *)((long)&(this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex + 4) = 0;
  *(undefined8 *)((long)&(this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex + 0xc) = 0;
  *(undefined8 *)((long)&(this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex + 0x14) = 0;
  (this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->cleanSubVer)._M_dataplus._M_p = (pointer)&(this->cleanSubVer).field_2;
  (this->cleanSubVer)._M_string_length = 0;
  (this->cleanSubVer).field_2._M_local_buf[0] = '\0';
  this->m_prefer_evict = SUB41(pNVar8[4],0);
  (this->fSuccessfullyConnected)._M_base._M_i = false;
  (this->fDisconnect)._M_base._M_i = false;
  (this->grantOutbound).sem = (CSemaphore *)0x0;
  (this->grantOutbound).fHaveGrant = false;
  (this->nRefCount).super___atomic_base<int>._M_i = 0;
  this->nKeyedNetGroup = (uint64_t)addrIn;
  (this->fPauseRecv)._M_base._M_i = false;
  (this->fPauseSend)._M_base._M_i = false;
  this->m_conn_type = (ConnectionType)addrNameIn;
  (this->m_bloom_filter_loaded)._M_base._M_i = false;
  this->m_bip152_highbandwidth_to = (__atomic_base<bool>)0x0;
  this->m_bip152_highbandwidth_from = (__atomic_base<bool>)0x0;
  this->m_has_all_wanted_services = (__atomic_base<bool>)0x0;
  this->m_relays_txs = (__atomic_base<bool>)0x0;
  (this->m_last_block_time)._M_i.__r = 0;
  (this->m_last_tx_time)._M_i.__r = 0;
  (this->m_last_ping_time)._M_i.__r = 0;
  (this->m_min_ping_time)._M_i.__r = 0x7fffffffffffffff;
  this->id = idIn;
  this->nLocalHostNonce = nKeyedNetGroupIn;
  (this->m_greatest_common_version).super___atomic_base<int>._M_i = 0xd1;
  this->m_recv_flood_size = *(undefined8 *)(pNVar8 + 6);
  args_1 = &this->vRecvMsg;
  (this->vRecvMsg).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)args_1;
  (this->vRecvMsg).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)args_1;
  (this->vRecvMsg).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node.
  _M_size = 0;
  (this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_msg_process_queue).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_msg_process_queue;
  (this->m_msg_process_queue).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_msg_process_queue;
  (this->m_msg_process_queue).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl.
  _M_node._M_size = 0;
  this->m_msg_process_queue_size = 0;
  CService::CService(&this->m_addr_local);
  *(undefined8 *)((long)&(this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0
  ;
  (this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_i2p_sam_session)._M_t.
  super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
  super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl = *(Session **)(pNVar8 + 2);
  pNVar8[2] = None;
  pNVar8[3] = None;
  if (((ConnectionType)addrNameIn != INBOUND & (undefined1)conn_type_in) != INBOUND) {
    __assert_fail("conn_type_in == ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ,0xec7,
                  "CNode::CNode(NodeId, std::shared_ptr<Sock>, const CAddress &, uint64_t, uint64_t, const CAddress &, const std::string &, ConnectionType, bool, CNodeOptions &&)"
                 );
  }
  args = &this->id;
  lVar15 = 0;
  do {
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::operator[](&this->mapRecvBytesPerMsgType,
                           (key_type *)
                           ((long)&ALL_NET_MESSAGE_TYPES_abi_cxx11_._M_elems[0]._M_dataplus._M_p +
                           lVar15));
    *pmVar13 = 0;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0x460);
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::operator[](&this->mapRecvBytesPerMsgType,&NET_MESSAGE_TYPE_OTHER_abi_cxx11_);
  *pmVar13 = 0;
  if (fLogIPs == true) {
    pLVar14 = LogInstance();
    bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar14,NET,Debug);
    if (bVar10) {
      logging_function._M_str = "CNode";
      logging_function._M_len = 5;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      LogPrintf_<std::__cxx11::string,long>
                (logging_function,source_file,0xecf,IPC|MEMPOOLREJ|REINDEX|ADDRMAN|RPC|ZMQ|HTTP|TOR,
                 (Level)__return_storage_ptr__,(char *)args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                 (long *)args_1);
    }
  }
  else {
    pLVar14 = LogInstance();
    bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar14,NET,Debug);
    if (bVar10) {
      logging_function_00._M_str = "CNode";
      logging_function_00._M_len = 5;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_00._M_len = 0x50;
      LogPrintf_<long>(logging_function_00,source_file_00,0xed1,NET,Debug,
                       "Added connection peer=%d\n",args);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CNode::CNode(NodeId idIn,
             std::shared_ptr<Sock> sock,
             const CAddress& addrIn,
             uint64_t nKeyedNetGroupIn,
             uint64_t nLocalHostNonceIn,
             const CAddress& addrBindIn,
             const std::string& addrNameIn,
             ConnectionType conn_type_in,
             bool inbound_onion,
             CNodeOptions&& node_opts)
    : m_transport{MakeTransport(idIn, node_opts.use_v2transport, conn_type_in == ConnectionType::INBOUND)},
      m_permission_flags{node_opts.permission_flags},
      m_sock{sock},
      m_connected{GetTime<std::chrono::seconds>()},
      addr{addrIn},
      addrBind{addrBindIn},
      m_addr_name{addrNameIn.empty() ? addr.ToStringAddrPort() : addrNameIn},
      m_dest(addrNameIn),
      m_inbound_onion{inbound_onion},
      m_prefer_evict{node_opts.prefer_evict},
      nKeyedNetGroup{nKeyedNetGroupIn},
      m_conn_type{conn_type_in},
      id{idIn},
      nLocalHostNonce{nLocalHostNonceIn},
      m_recv_flood_size{node_opts.recv_flood_size},
      m_i2p_sam_session{std::move(node_opts.i2p_sam_session)}
{
    if (inbound_onion) assert(conn_type_in == ConnectionType::INBOUND);

    for (const auto& msg : ALL_NET_MESSAGE_TYPES) {
        mapRecvBytesPerMsgType[msg] = 0;
    }
    mapRecvBytesPerMsgType[NET_MESSAGE_TYPE_OTHER] = 0;

    if (fLogIPs) {
        LogDebug(BCLog::NET, "Added connection to %s peer=%d\n", m_addr_name, id);
    } else {
        LogDebug(BCLog::NET, "Added connection peer=%d\n", id);
    }
}